

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,LengthExpression *expression)

{
  int index_00;
  Value *pVVar1;
  VariableValue *this_00;
  PrimitiveSimpleObject *this_01;
  Type *this_02;
  ArrayValue *local_c8;
  allocator<char> local_91;
  string local_90;
  int local_70;
  int size;
  string local_60;
  Symbol local_40;
  int local_1c;
  LengthExpression *pLStack_18;
  int index;
  LengthExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  pLStack_18 = expression;
  expression_local = (LengthExpression *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_40,&local_60);
  index_00 = FunctionTable::Get(&this->table_,&local_40);
  Symbol::~Symbol(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_1c = index_00;
  pVVar1 = FrameEmulator::Get(&this->frame_,index_00);
  if (pVVar1 == (Value *)0x0) {
    local_c8 = (ArrayValue *)0x0;
  }
  else {
    local_c8 = (ArrayValue *)__dynamic_cast(pVVar1,&Value::typeinfo,&ArrayValue::typeinfo,0);
  }
  local_70 = ArrayValue::GetSize(local_c8);
  this_00 = (VariableValue *)operator_new(0x50);
  this_01 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_02 = (Type *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"int",&local_91);
  Type::Type(this_02,&local_90);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_01,this_02);
  VariableValue::VariableValue(this_00,this_01,local_70);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_00;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LengthExpression* expression) {
  int index = table_.Get(Symbol(expression->variable_name_));
  int size = dynamic_cast<ArrayValue*>(frame_.Get(index))->GetSize();
  tos_value_ =
      new VariableValue(new PrimitiveSimpleObject(new Type("int")), size);
}